

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::RenamingSubstitution::output
          (RenamingSubstitution *this,ostream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"{ _query: ");
  poVar1 = Lib::operator<<(poVar1,&this->_query);
  poVar1 = std::operator<<(poVar1,", _result: ");
  poVar1 = Lib::operator<<(poVar1,&this->_result);
  std::operator<<(poVar1," }");
  return;
}

Assistant:

void output(std::ostream& out) const final override
      { out << "{ _query: " << _query << ", _result: " << _result << " }"; }